

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O1

char * __thiscall FCommandLine::operator[](FCommandLine *this,int i)

{
  int iVar1;
  ulong uVar2;
  char **argv;
  
  if (this->_argv == (char **)0x0) {
    iVar1 = argc(this);
    uVar2 = (this->argsize + 7U >> 3) + (long)iVar1;
    argv = (char **)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
    this->_argv = argv;
    *argv = (char *)(argv + iVar1);
    ParseCommandLine(this->cmd,(int *)0x0,argv,this->noescapes);
  }
  return this->_argv[i];
}

Assistant:

char *FCommandLine::operator[] (int i)
{
	if (_argv == NULL)
	{
		int count = argc();
		_argv = new char *[count + (argsize+sizeof(char*)-1)/sizeof(char*)];
		_argv[0] = (char *)_argv + count*sizeof(char *);
		ParseCommandLine (cmd, NULL, _argv, noescapes);
	}
	return _argv[i];
}